

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memalign_unittest.cc
# Opt level: O1

void __thiscall MemalignTest_Basic_Test::TestBody(MemalignTest_Basic_Test *this)

{
  uint uVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  internal iVar4;
  int iVar5;
  char *pcVar6;
  char *__ptr;
  char *__ptr_00;
  long lVar7;
  void *__ptr_01;
  ulong uVar8;
  undefined8 extraout_RAX;
  uint uVar9;
  ulong uVar10;
  undefined8 uVar11;
  ulong uVar12;
  uchar *buffer_1;
  uchar *buffer_2;
  ulong uVar13;
  size_t __size;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  char cVar22;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  undefined1 auVar23 [16];
  char cVar40;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  int iVar72;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  int iVar153;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  int iVar154;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  int iVar155;
  undefined1 auVar152 [16];
  int iVar156;
  int iVar172;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  int iVar173;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar174 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  AssertHelper local_58;
  code *local_50;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  void *ptr;
  
  bVar16 = false;
  uVar9 = 1;
  do {
    uVar8 = (ulong)uVar9;
    bVar17 = false;
    iVar5 = 0;
    do {
      uVar13 = (ulong)iVar5;
      local_38._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           memalign(uVar8,uVar13);
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )Misallignment(local_38._M_head_impl,uVar8);
      local_58.data_._0_4_ = 0;
      testing::internal::CmpHelperEQ<unsigned_long,int>
                ((internal *)&local_50,"Misallignment(ptr, a)","0",
                 (unsigned_long *)&gtest_ar.message_,(int *)&local_58);
      if (local_50._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar.message_);
        pcVar6 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar6 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/memalign_unittest.cc"
                   ,0x84,pcVar6);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&gtest_ar.message_);
LAB_001095e9:
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          (**(code **)(*(long *)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 8))();
        }
        if (gtest_ar._0_8_ != 0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&gtest_ar,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       gtest_ar._0_8_);
        }
        if (!bVar17) {
          if (!bVar16) {
            return;
          }
          goto LAB_0010963c;
        }
        break;
      }
      if (gtest_ar._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar._0_8_);
      }
      auVar3 = _DAT_00139090;
      if (0 < iVar5) {
        lVar7 = uVar13 - 1;
        auVar18._8_4_ = (int)lVar7;
        auVar18._0_8_ = lVar7;
        auVar18._12_4_ = (int)((ulong)lVar7 >> 0x20);
        uVar12 = 0;
        auVar68 = _DAT_00139080;
        auVar84 = _DAT_00139070;
        auVar179 = _DAT_00139060;
        auVar130 = _DAT_00139050;
        auVar50 = _DAT_00139040;
        auVar54 = _DAT_00139030;
        auVar58 = _DAT_00139020;
        auVar62 = _DAT_00139010;
        do {
          auVar66 = auVar18 ^ auVar3;
          auVar73 = auVar68 ^ auVar3;
          iVar153 = auVar66._0_4_;
          iVar156 = -(uint)(iVar153 < auVar73._0_4_);
          iVar154 = auVar66._4_4_;
          auVar74._4_4_ = -(uint)(iVar154 < auVar73._4_4_);
          iVar155 = auVar66._8_4_;
          iVar172 = -(uint)(iVar155 < auVar73._8_4_);
          iVar72 = auVar66._12_4_;
          auVar74._12_4_ = -(uint)(iVar72 < auVar73._12_4_);
          auVar121._4_4_ = iVar156;
          auVar121._0_4_ = iVar156;
          auVar121._8_4_ = iVar172;
          auVar121._12_4_ = iVar172;
          auVar174 = pshuflw(in_XMM13,auVar121,0xe8);
          auVar66._4_4_ = -(uint)(auVar73._4_4_ == iVar154);
          auVar66._12_4_ = -(uint)(auVar73._12_4_ == iVar72);
          auVar66._0_4_ = auVar66._4_4_;
          auVar66._8_4_ = auVar66._12_4_;
          auVar175 = pshuflw(in_XMM14,auVar66,0xe8);
          auVar74._0_4_ = auVar74._4_4_;
          auVar74._8_4_ = auVar74._12_4_;
          auVar73 = pshuflw(auVar174,auVar74,0xe8);
          auVar176._8_4_ = 0xffffffff;
          auVar176._0_8_ = 0xffffffffffffffff;
          auVar176._12_4_ = 0xffffffff;
          auVar73 = (auVar73 | auVar175 & auVar174) ^ auVar176;
          auVar73 = packssdw(auVar73,auVar73);
          cVar22 = (char)uVar12;
          if ((auVar73 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_38._M_head_impl[uVar12] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar22 + 'x');
          }
          auVar74 = auVar66 & auVar121 | auVar74;
          auVar66 = packssdw(auVar74,auVar74);
          auVar66 = packssdw(auVar66 ^ auVar176,auVar66 ^ auVar176);
          auVar66 = packsswb(auVar66,auVar66);
          if ((auVar66._0_4_ >> 8 & 1) != 0) {
            local_38._M_head_impl[uVar12 + 1] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar22 + 'y');
          }
          auVar66 = auVar84 ^ auVar3;
          iVar156 = -(uint)(iVar153 < auVar66._0_4_);
          auVar175._4_4_ = -(uint)(iVar154 < auVar66._4_4_);
          iVar172 = -(uint)(iVar155 < auVar66._8_4_);
          auVar175._12_4_ = -(uint)(iVar72 < auVar66._12_4_);
          auVar73._4_4_ = iVar156;
          auVar73._0_4_ = iVar156;
          auVar73._8_4_ = iVar172;
          auVar73._12_4_ = iVar172;
          auVar174._4_4_ = -(uint)(auVar66._4_4_ == iVar154);
          auVar174._12_4_ = -(uint)(auVar66._12_4_ == iVar72);
          auVar174._0_4_ = auVar174._4_4_;
          auVar174._8_4_ = auVar174._12_4_;
          auVar175._0_4_ = auVar175._4_4_;
          auVar175._8_4_ = auVar175._12_4_;
          auVar66 = auVar174 & auVar73 | auVar175;
          auVar66 = packssdw(auVar66,auVar66);
          auVar66 = packssdw(auVar66 ^ auVar176,auVar66 ^ auVar176);
          auVar66 = packsswb(auVar66,auVar66);
          if ((auVar66._0_4_ >> 0x10 & 1) != 0) {
            local_38._M_head_impl[uVar12 + 2] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar22 + 'z');
          }
          auVar73 = pshufhw(auVar73,auVar73,0x84);
          auVar121 = pshufhw(auVar174,auVar174,0x84);
          auVar74 = pshufhw(auVar73,auVar175,0x84);
          auVar73 = (auVar74 | auVar121 & auVar73) ^ auVar176;
          auVar73 = packssdw(auVar73,auVar73);
          auVar73 = packsswb(auVar73,auVar73);
          if ((auVar73._0_4_ >> 0x18 & 1) != 0) {
            local_38._M_head_impl[uVar12 + 3] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar22 + '{');
          }
          auVar73 = auVar179 ^ auVar3;
          iVar156 = -(uint)(iVar153 < auVar73._0_4_);
          auVar76._4_4_ = -(uint)(iVar154 < auVar73._4_4_);
          iVar172 = -(uint)(iVar155 < auVar73._8_4_);
          auVar76._12_4_ = -(uint)(iVar72 < auVar73._12_4_);
          auVar122._4_4_ = iVar156;
          auVar122._0_4_ = iVar156;
          auVar122._8_4_ = iVar172;
          auVar122._12_4_ = iVar172;
          auVar66 = pshuflw(auVar66,auVar122,0xe8);
          auVar75._4_4_ = -(uint)(auVar73._4_4_ == iVar154);
          auVar75._12_4_ = -(uint)(auVar73._12_4_ == iVar72);
          auVar75._0_4_ = auVar75._4_4_;
          auVar75._8_4_ = auVar75._12_4_;
          auVar74 = pshuflw(auVar176,auVar75,0xe8);
          auVar76._0_4_ = auVar76._4_4_;
          auVar76._8_4_ = auVar76._12_4_;
          auVar73 = pshuflw(auVar66,auVar76,0xe8);
          auVar177._8_4_ = 0xffffffff;
          auVar177._0_8_ = 0xffffffffffffffff;
          auVar177._12_4_ = 0xffffffff;
          auVar66 = (auVar73 | auVar74 & auVar66) ^ auVar177;
          auVar66 = packssdw(auVar66,auVar66);
          auVar66 = packsswb(auVar66,auVar66);
          if ((auVar66 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_38._M_head_impl[uVar12 + 4] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar22 + '|');
          }
          auVar76 = auVar75 & auVar122 | auVar76;
          auVar66 = packssdw(auVar76,auVar76);
          auVar66 = packssdw(auVar66 ^ auVar177,auVar66 ^ auVar177);
          auVar66 = packsswb(auVar66,auVar66);
          if ((auVar66._4_2_ >> 8 & 1) != 0) {
            local_38._M_head_impl[uVar12 + 5] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar22 + '}');
          }
          auVar66 = auVar130 ^ auVar3;
          iVar156 = -(uint)(iVar153 < auVar66._0_4_);
          auVar157._4_4_ = -(uint)(iVar154 < auVar66._4_4_);
          iVar172 = -(uint)(iVar155 < auVar66._8_4_);
          auVar157._12_4_ = -(uint)(iVar72 < auVar66._12_4_);
          auVar77._4_4_ = iVar156;
          auVar77._0_4_ = iVar156;
          auVar77._8_4_ = iVar172;
          auVar77._12_4_ = iVar172;
          auVar123._4_4_ = -(uint)(auVar66._4_4_ == iVar154);
          auVar123._12_4_ = -(uint)(auVar66._12_4_ == iVar72);
          auVar123._0_4_ = auVar123._4_4_;
          auVar123._8_4_ = auVar123._12_4_;
          auVar157._0_4_ = auVar157._4_4_;
          auVar157._8_4_ = auVar157._12_4_;
          auVar66 = auVar123 & auVar77 | auVar157;
          auVar66 = packssdw(auVar66,auVar66);
          auVar66 = packssdw(auVar66 ^ auVar177,auVar66 ^ auVar177);
          auVar66 = packsswb(auVar66,auVar66);
          if ((auVar66 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_38._M_head_impl[uVar12 + 6] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar22 + '~');
          }
          auVar73 = pshufhw(auVar77,auVar77,0x84);
          auVar121 = pshufhw(auVar123,auVar123,0x84);
          auVar74 = pshufhw(auVar73,auVar157,0x84);
          auVar73 = (auVar74 | auVar121 & auVar73) ^ auVar177;
          auVar73 = packssdw(auVar73,auVar73);
          auVar73 = packsswb(auVar73,auVar73);
          if ((auVar73._6_2_ >> 8 & 1) != 0) {
            local_38._M_head_impl[uVar12 + 7] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar22 + '\x7f');
          }
          auVar73 = auVar50 ^ auVar3;
          iVar156 = -(uint)(iVar153 < auVar73._0_4_);
          auVar79._4_4_ = -(uint)(iVar154 < auVar73._4_4_);
          iVar172 = -(uint)(iVar155 < auVar73._8_4_);
          auVar79._12_4_ = -(uint)(iVar72 < auVar73._12_4_);
          auVar124._4_4_ = iVar156;
          auVar124._0_4_ = iVar156;
          auVar124._8_4_ = iVar172;
          auVar124._12_4_ = iVar172;
          auVar66 = pshuflw(auVar66,auVar124,0xe8);
          auVar78._4_4_ = -(uint)(auVar73._4_4_ == iVar154);
          auVar78._12_4_ = -(uint)(auVar73._12_4_ == iVar72);
          auVar78._0_4_ = auVar78._4_4_;
          auVar78._8_4_ = auVar78._12_4_;
          auVar74 = pshuflw(auVar177,auVar78,0xe8);
          auVar79._0_4_ = auVar79._4_4_;
          auVar79._8_4_ = auVar79._12_4_;
          auVar73 = pshuflw(auVar66,auVar79,0xe8);
          auVar178._8_4_ = 0xffffffff;
          auVar178._0_8_ = 0xffffffffffffffff;
          auVar178._12_4_ = 0xffffffff;
          auVar66 = (auVar73 | auVar74 & auVar66) ^ auVar178;
          auVar66 = packssdw(auVar66,auVar66);
          auVar66 = packsswb(auVar66,auVar66);
          if ((auVar66 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_38._M_head_impl[uVar12 + 8] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar22 + -0x80);
          }
          auVar79 = auVar78 & auVar124 | auVar79;
          auVar66 = packssdw(auVar79,auVar79);
          auVar66 = packssdw(auVar66 ^ auVar178,auVar66 ^ auVar178);
          auVar66 = packsswb(auVar66,auVar66);
          if ((auVar66._8_2_ >> 8 & 1) != 0) {
            local_38._M_head_impl[uVar12 + 9] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar22 + -0x7f);
          }
          auVar66 = auVar54 ^ auVar3;
          iVar156 = -(uint)(iVar153 < auVar66._0_4_);
          auVar158._4_4_ = -(uint)(iVar154 < auVar66._4_4_);
          iVar172 = -(uint)(iVar155 < auVar66._8_4_);
          auVar158._12_4_ = -(uint)(iVar72 < auVar66._12_4_);
          auVar80._4_4_ = iVar156;
          auVar80._0_4_ = iVar156;
          auVar80._8_4_ = iVar172;
          auVar80._12_4_ = iVar172;
          auVar125._4_4_ = -(uint)(auVar66._4_4_ == iVar154);
          auVar125._12_4_ = -(uint)(auVar66._12_4_ == iVar72);
          auVar125._0_4_ = auVar125._4_4_;
          auVar125._8_4_ = auVar125._12_4_;
          auVar158._0_4_ = auVar158._4_4_;
          auVar158._8_4_ = auVar158._12_4_;
          auVar66 = auVar125 & auVar80 | auVar158;
          auVar66 = packssdw(auVar66,auVar66);
          auVar66 = packssdw(auVar66 ^ auVar178,auVar66 ^ auVar178);
          auVar66 = packsswb(auVar66,auVar66);
          if ((auVar66 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            local_38._M_head_impl[uVar12 + 10] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar22 + -0x7e);
          }
          auVar73 = pshufhw(auVar80,auVar80,0x84);
          auVar121 = pshufhw(auVar125,auVar125,0x84);
          auVar74 = pshufhw(auVar73,auVar158,0x84);
          auVar73 = (auVar74 | auVar121 & auVar73) ^ auVar178;
          auVar73 = packssdw(auVar73,auVar73);
          auVar73 = packsswb(auVar73,auVar73);
          if ((auVar73._10_2_ >> 8 & 1) != 0) {
            local_38._M_head_impl[uVar12 + 0xb] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar22 + -0x7d);
          }
          auVar73 = auVar58 ^ auVar3;
          iVar156 = -(uint)(iVar153 < auVar73._0_4_);
          auVar82._4_4_ = -(uint)(iVar154 < auVar73._4_4_);
          iVar172 = -(uint)(iVar155 < auVar73._8_4_);
          auVar82._12_4_ = -(uint)(iVar72 < auVar73._12_4_);
          auVar126._4_4_ = iVar156;
          auVar126._0_4_ = iVar156;
          auVar126._8_4_ = iVar172;
          auVar126._12_4_ = iVar172;
          auVar66 = pshuflw(auVar66,auVar126,0xe8);
          auVar81._4_4_ = -(uint)(auVar73._4_4_ == iVar154);
          auVar81._12_4_ = -(uint)(auVar73._12_4_ == iVar72);
          auVar81._0_4_ = auVar81._4_4_;
          auVar81._8_4_ = auVar81._12_4_;
          auVar74 = pshuflw(auVar178,auVar81,0xe8);
          auVar82._0_4_ = auVar82._4_4_;
          auVar82._8_4_ = auVar82._12_4_;
          auVar73 = pshuflw(auVar66,auVar82,0xe8);
          in_XMM14._8_4_ = 0xffffffff;
          in_XMM14._0_8_ = 0xffffffffffffffff;
          in_XMM14._12_4_ = 0xffffffff;
          auVar66 = (auVar73 | auVar74 & auVar66) ^ in_XMM14;
          auVar66 = packssdw(auVar66,auVar66);
          auVar66 = packsswb(auVar66,auVar66);
          if ((auVar66 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_38._M_head_impl[uVar12 + 0xc] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar22 + -0x7c);
          }
          auVar82 = auVar81 & auVar126 | auVar82;
          auVar66 = packssdw(auVar82,auVar82);
          auVar66 = packssdw(auVar66 ^ in_XMM14,auVar66 ^ in_XMM14);
          auVar66 = packsswb(auVar66,auVar66);
          if ((auVar66._12_2_ >> 8 & 1) != 0) {
            local_38._M_head_impl[uVar12 + 0xd] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar22 + -0x7b);
          }
          auVar66 = auVar62 ^ auVar3;
          auVar159._0_4_ = -(uint)(iVar153 < auVar66._0_4_);
          auVar159._4_4_ = -(uint)(iVar154 < auVar66._4_4_);
          auVar159._8_4_ = -(uint)(iVar155 < auVar66._8_4_);
          auVar159._12_4_ = -(uint)(iVar72 < auVar66._12_4_);
          auVar83._4_4_ = auVar159._0_4_;
          auVar83._0_4_ = auVar159._0_4_;
          auVar83._8_4_ = auVar159._8_4_;
          auVar83._12_4_ = auVar159._8_4_;
          iVar153 = -(uint)(auVar66._4_4_ == iVar154);
          iVar154 = -(uint)(auVar66._12_4_ == iVar72);
          auVar67._4_4_ = iVar153;
          auVar67._0_4_ = iVar153;
          auVar67._8_4_ = iVar154;
          auVar67._12_4_ = iVar154;
          auVar127._4_4_ = auVar159._4_4_;
          auVar127._0_4_ = auVar159._4_4_;
          auVar127._8_4_ = auVar159._12_4_;
          auVar127._12_4_ = auVar159._12_4_;
          in_XMM13 = auVar67 & auVar83 | auVar127;
          auVar66 = packssdw(auVar159,in_XMM13);
          auVar66 = packssdw(auVar66 ^ in_XMM14,auVar66 ^ in_XMM14);
          auVar66 = packsswb(auVar66,auVar66);
          if ((auVar66 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_38._M_head_impl[uVar12 + 0xe] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar22 + -0x7a);
          }
          auVar73 = pshufhw(auVar83,auVar83,0x84);
          auVar66 = pshufhw(auVar67,auVar67,0x84);
          auVar74 = pshufhw(auVar73,auVar127,0x84);
          auVar66 = packssdw(auVar66 & auVar73,(auVar74 | auVar66 & auVar73) ^ in_XMM14);
          auVar66 = packsswb(auVar66,auVar66);
          if ((auVar66._14_2_ >> 8 & 1) != 0) {
            local_38._M_head_impl[uVar12 + 0xf] =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                 (cVar22 + -0x79);
          }
          uVar12 = uVar12 + 0x10;
          lVar7 = auVar68._8_8_;
          auVar68._0_8_ = auVar68._0_8_ + 0x10;
          auVar68._8_8_ = lVar7 + 0x10;
          lVar7 = auVar84._8_8_;
          auVar84._0_8_ = auVar84._0_8_ + 0x10;
          auVar84._8_8_ = lVar7 + 0x10;
          lVar7 = auVar179._8_8_;
          auVar179._0_8_ = auVar179._0_8_ + 0x10;
          auVar179._8_8_ = lVar7 + 0x10;
          lVar7 = auVar130._8_8_;
          auVar130._0_8_ = auVar130._0_8_ + 0x10;
          auVar130._8_8_ = lVar7 + 0x10;
          lVar7 = auVar50._8_8_;
          auVar50._0_8_ = auVar50._0_8_ + 0x10;
          auVar50._8_8_ = lVar7 + 0x10;
          lVar7 = auVar54._8_8_;
          auVar54._0_8_ = auVar54._0_8_ + 0x10;
          auVar54._8_8_ = lVar7 + 0x10;
          lVar7 = auVar58._8_8_;
          auVar58._0_8_ = auVar58._0_8_ + 0x10;
          auVar58._8_8_ = lVar7 + 0x10;
          lVar7 = auVar62._8_8_;
          auVar62._0_8_ = auVar62._0_8_ + 0x10;
          auVar62._8_8_ = lVar7 + 0x10;
        } while ((iVar5 + 0xfU & 0xfffffff0) != uVar12);
      }
      bVar15 = iVar5 < 1;
      bVar14 = bVar15;
      if (0 < iVar5) {
        if (*local_38._M_head_impl ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0x78) {
          uVar12 = 1;
          do {
            uVar10 = uVar12;
            if (uVar13 == uVar10) break;
            uVar12 = uVar10 + 1;
          } while ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                   ((char)(uVar10 + 1) + 'w') == local_38._M_head_impl[uVar10]);
          bVar14 = uVar13 <= uVar10;
          goto LAB_00108e71;
        }
LAB_0010a8b5:
        pcVar6 = "Check failed: Valid(ptr, s, \'x\')\n";
LAB_0010a8c5:
        uVar11 = 0x21;
        goto LAB_0010a8cf;
      }
LAB_00108e71:
      if (!bVar14) goto LAB_0010a8b5;
      free(local_38._M_head_impl);
      if (7 < uVar9) {
        iVar153 = posix_memalign(&local_38._M_head_impl,uVar8,uVar13);
        if (iVar153 == 0) {
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )Misallignment(local_38._M_head_impl,uVar8);
          local_58.data_._0_4_ = 0;
          testing::internal::CmpHelperEQ<unsigned_long,int>
                    ((internal *)&local_50,"Misallignment(ptr, a)","0",
                     (unsigned_long *)&gtest_ar.message_,(int *)&local_58);
          if (local_50._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&gtest_ar.message_);
            pcVar6 = "";
            if (gtest_ar._0_8_ != 0) {
              pcVar6 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_58,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/memalign_unittest.cc"
                       ,0x8b,pcVar6);
            testing::internal::AssertHelper::operator=(&local_58,(Message *)&gtest_ar.message_);
            goto LAB_001095e9;
          }
          if (gtest_ar._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar._0_8_);
          }
          auVar3 = _DAT_00139090;
          if (0 < iVar5) {
            lVar7 = uVar13 - 1;
            auVar19._8_4_ = (int)lVar7;
            auVar19._0_8_ = lVar7;
            auVar19._12_4_ = (int)((ulong)lVar7 >> 0x20);
            uVar12 = 0;
            auVar23 = _DAT_00139080;
            auVar41 = _DAT_00139070;
            auVar44 = _DAT_00139060;
            auVar47 = _DAT_00139050;
            auVar51 = _DAT_00139040;
            auVar55 = _DAT_00139030;
            auVar59 = _DAT_00139020;
            auVar63 = _DAT_00139010;
            do {
              auVar68 = auVar19 ^ auVar3;
              auVar84 = auVar23 ^ auVar3;
              iVar153 = auVar68._0_4_;
              iVar156 = -(uint)(iVar153 < auVar84._0_4_);
              iVar154 = auVar68._4_4_;
              auVar86._4_4_ = -(uint)(iVar154 < auVar84._4_4_);
              iVar155 = auVar68._8_4_;
              iVar172 = -(uint)(iVar155 < auVar84._8_4_);
              iVar72 = auVar68._12_4_;
              auVar86._12_4_ = -(uint)(iVar72 < auVar84._12_4_);
              auVar128._4_4_ = iVar156;
              auVar128._0_4_ = iVar156;
              auVar128._8_4_ = iVar172;
              auVar128._12_4_ = iVar172;
              auVar68 = pshuflw(in_XMM13,auVar128,0xe8);
              auVar85._4_4_ = -(uint)(auVar84._4_4_ == iVar154);
              auVar85._12_4_ = -(uint)(auVar84._12_4_ == iVar72);
              auVar85._0_4_ = auVar85._4_4_;
              auVar85._8_4_ = auVar85._12_4_;
              auVar179 = pshuflw(in_XMM14,auVar85,0xe8);
              auVar86._0_4_ = auVar86._4_4_;
              auVar86._8_4_ = auVar86._12_4_;
              auVar84 = pshuflw(auVar68,auVar86,0xe8);
              auVar180._8_4_ = 0xffffffff;
              auVar180._0_8_ = 0xffffffffffffffff;
              auVar180._12_4_ = 0xffffffff;
              auVar68 = (auVar84 | auVar179 & auVar68) ^ auVar180;
              auVar68 = packssdw(auVar68,auVar68);
              cVar22 = (char)uVar12;
              if ((auVar68 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                local_38._M_head_impl[uVar12] =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                     (cVar22 + 'y');
              }
              auVar86 = auVar85 & auVar128 | auVar86;
              auVar68 = packssdw(auVar86,auVar86);
              auVar68 = packssdw(auVar68 ^ auVar180,auVar68 ^ auVar180);
              auVar68 = packsswb(auVar68,auVar68);
              if ((auVar68._0_4_ >> 8 & 1) != 0) {
                local_38._M_head_impl[uVar12 + 1] =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                     (cVar22 + 'z');
              }
              auVar68 = auVar41 ^ auVar3;
              iVar156 = -(uint)(iVar153 < auVar68._0_4_);
              auVar160._4_4_ = -(uint)(iVar154 < auVar68._4_4_);
              iVar172 = -(uint)(iVar155 < auVar68._8_4_);
              auVar160._12_4_ = -(uint)(iVar72 < auVar68._12_4_);
              auVar87._4_4_ = iVar156;
              auVar87._0_4_ = iVar156;
              auVar87._8_4_ = iVar172;
              auVar87._12_4_ = iVar172;
              auVar129._4_4_ = -(uint)(auVar68._4_4_ == iVar154);
              auVar129._12_4_ = -(uint)(auVar68._12_4_ == iVar72);
              auVar129._0_4_ = auVar129._4_4_;
              auVar129._8_4_ = auVar129._12_4_;
              auVar160._0_4_ = auVar160._4_4_;
              auVar160._8_4_ = auVar160._12_4_;
              auVar68 = auVar129 & auVar87 | auVar160;
              auVar68 = packssdw(auVar68,auVar68);
              auVar68 = packssdw(auVar68 ^ auVar180,auVar68 ^ auVar180);
              auVar68 = packsswb(auVar68,auVar68);
              if ((auVar68._0_4_ >> 0x10 & 1) != 0) {
                local_38._M_head_impl[uVar12 + 2] =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                     (cVar22 + '{');
              }
              auVar84 = pshufhw(auVar87,auVar87,0x84);
              auVar130 = pshufhw(auVar129,auVar129,0x84);
              auVar179 = pshufhw(auVar84,auVar160,0x84);
              auVar84 = (auVar179 | auVar130 & auVar84) ^ auVar180;
              auVar84 = packssdw(auVar84,auVar84);
              auVar84 = packsswb(auVar84,auVar84);
              if ((auVar84._0_4_ >> 0x18 & 1) != 0) {
                local_38._M_head_impl[uVar12 + 3] =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                     (cVar22 + '|');
              }
              auVar84 = auVar44 ^ auVar3;
              iVar156 = -(uint)(iVar153 < auVar84._0_4_);
              auVar89._4_4_ = -(uint)(iVar154 < auVar84._4_4_);
              iVar172 = -(uint)(iVar155 < auVar84._8_4_);
              auVar89._12_4_ = -(uint)(iVar72 < auVar84._12_4_);
              auVar131._4_4_ = iVar156;
              auVar131._0_4_ = iVar156;
              auVar131._8_4_ = iVar172;
              auVar131._12_4_ = iVar172;
              auVar68 = pshuflw(auVar68,auVar131,0xe8);
              auVar88._4_4_ = -(uint)(auVar84._4_4_ == iVar154);
              auVar88._12_4_ = -(uint)(auVar84._12_4_ == iVar72);
              auVar88._0_4_ = auVar88._4_4_;
              auVar88._8_4_ = auVar88._12_4_;
              auVar179 = pshuflw(auVar180,auVar88,0xe8);
              auVar89._0_4_ = auVar89._4_4_;
              auVar89._8_4_ = auVar89._12_4_;
              auVar84 = pshuflw(auVar68,auVar89,0xe8);
              auVar181._8_4_ = 0xffffffff;
              auVar181._0_8_ = 0xffffffffffffffff;
              auVar181._12_4_ = 0xffffffff;
              auVar68 = (auVar84 | auVar179 & auVar68) ^ auVar181;
              auVar68 = packssdw(auVar68,auVar68);
              auVar68 = packsswb(auVar68,auVar68);
              if ((auVar68 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                local_38._M_head_impl[uVar12 + 4] =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                     (cVar22 + '}');
              }
              auVar89 = auVar88 & auVar131 | auVar89;
              auVar68 = packssdw(auVar89,auVar89);
              auVar68 = packssdw(auVar68 ^ auVar181,auVar68 ^ auVar181);
              auVar68 = packsswb(auVar68,auVar68);
              if ((auVar68._4_2_ >> 8 & 1) != 0) {
                local_38._M_head_impl[uVar12 + 5] =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                     (cVar22 + '~');
              }
              auVar68 = auVar47 ^ auVar3;
              iVar156 = -(uint)(iVar153 < auVar68._0_4_);
              auVar161._4_4_ = -(uint)(iVar154 < auVar68._4_4_);
              iVar172 = -(uint)(iVar155 < auVar68._8_4_);
              auVar161._12_4_ = -(uint)(iVar72 < auVar68._12_4_);
              auVar90._4_4_ = iVar156;
              auVar90._0_4_ = iVar156;
              auVar90._8_4_ = iVar172;
              auVar90._12_4_ = iVar172;
              auVar132._4_4_ = -(uint)(auVar68._4_4_ == iVar154);
              auVar132._12_4_ = -(uint)(auVar68._12_4_ == iVar72);
              auVar132._0_4_ = auVar132._4_4_;
              auVar132._8_4_ = auVar132._12_4_;
              auVar161._0_4_ = auVar161._4_4_;
              auVar161._8_4_ = auVar161._12_4_;
              auVar68 = auVar132 & auVar90 | auVar161;
              auVar68 = packssdw(auVar68,auVar68);
              auVar68 = packssdw(auVar68 ^ auVar181,auVar68 ^ auVar181);
              auVar68 = packsswb(auVar68,auVar68);
              if ((auVar68 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                local_38._M_head_impl[uVar12 + 6] =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                     (cVar22 + '\x7f');
              }
              auVar84 = pshufhw(auVar90,auVar90,0x84);
              auVar130 = pshufhw(auVar132,auVar132,0x84);
              auVar179 = pshufhw(auVar84,auVar161,0x84);
              auVar84 = (auVar179 | auVar130 & auVar84) ^ auVar181;
              auVar84 = packssdw(auVar84,auVar84);
              auVar84 = packsswb(auVar84,auVar84);
              if ((auVar84._6_2_ >> 8 & 1) != 0) {
                local_38._M_head_impl[uVar12 + 7] =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                     (cVar22 + -0x80);
              }
              auVar84 = auVar51 ^ auVar3;
              iVar156 = -(uint)(iVar153 < auVar84._0_4_);
              auVar92._4_4_ = -(uint)(iVar154 < auVar84._4_4_);
              iVar172 = -(uint)(iVar155 < auVar84._8_4_);
              auVar92._12_4_ = -(uint)(iVar72 < auVar84._12_4_);
              auVar133._4_4_ = iVar156;
              auVar133._0_4_ = iVar156;
              auVar133._8_4_ = iVar172;
              auVar133._12_4_ = iVar172;
              auVar68 = pshuflw(auVar68,auVar133,0xe8);
              auVar91._4_4_ = -(uint)(auVar84._4_4_ == iVar154);
              auVar91._12_4_ = -(uint)(auVar84._12_4_ == iVar72);
              auVar91._0_4_ = auVar91._4_4_;
              auVar91._8_4_ = auVar91._12_4_;
              auVar179 = pshuflw(auVar181,auVar91,0xe8);
              auVar92._0_4_ = auVar92._4_4_;
              auVar92._8_4_ = auVar92._12_4_;
              auVar84 = pshuflw(auVar68,auVar92,0xe8);
              auVar182._8_4_ = 0xffffffff;
              auVar182._0_8_ = 0xffffffffffffffff;
              auVar182._12_4_ = 0xffffffff;
              auVar68 = (auVar84 | auVar179 & auVar68) ^ auVar182;
              auVar68 = packssdw(auVar68,auVar68);
              auVar68 = packsswb(auVar68,auVar68);
              if ((auVar68 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                local_38._M_head_impl[uVar12 + 8] =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                     (cVar22 + -0x7f);
              }
              auVar92 = auVar91 & auVar133 | auVar92;
              auVar68 = packssdw(auVar92,auVar92);
              auVar68 = packssdw(auVar68 ^ auVar182,auVar68 ^ auVar182);
              auVar68 = packsswb(auVar68,auVar68);
              if ((auVar68._8_2_ >> 8 & 1) != 0) {
                local_38._M_head_impl[uVar12 + 9] =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                     (cVar22 + -0x7e);
              }
              auVar68 = auVar55 ^ auVar3;
              iVar156 = -(uint)(iVar153 < auVar68._0_4_);
              auVar162._4_4_ = -(uint)(iVar154 < auVar68._4_4_);
              iVar172 = -(uint)(iVar155 < auVar68._8_4_);
              auVar162._12_4_ = -(uint)(iVar72 < auVar68._12_4_);
              auVar93._4_4_ = iVar156;
              auVar93._0_4_ = iVar156;
              auVar93._8_4_ = iVar172;
              auVar93._12_4_ = iVar172;
              auVar134._4_4_ = -(uint)(auVar68._4_4_ == iVar154);
              auVar134._12_4_ = -(uint)(auVar68._12_4_ == iVar72);
              auVar134._0_4_ = auVar134._4_4_;
              auVar134._8_4_ = auVar134._12_4_;
              auVar162._0_4_ = auVar162._4_4_;
              auVar162._8_4_ = auVar162._12_4_;
              auVar68 = auVar134 & auVar93 | auVar162;
              auVar68 = packssdw(auVar68,auVar68);
              auVar68 = packssdw(auVar68 ^ auVar182,auVar68 ^ auVar182);
              auVar68 = packsswb(auVar68,auVar68);
              if ((auVar68 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                local_38._M_head_impl[uVar12 + 10] =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                     (cVar22 + -0x7d);
              }
              auVar84 = pshufhw(auVar93,auVar93,0x84);
              auVar130 = pshufhw(auVar134,auVar134,0x84);
              auVar179 = pshufhw(auVar84,auVar162,0x84);
              auVar84 = (auVar179 | auVar130 & auVar84) ^ auVar182;
              auVar84 = packssdw(auVar84,auVar84);
              auVar84 = packsswb(auVar84,auVar84);
              if ((auVar84._10_2_ >> 8 & 1) != 0) {
                local_38._M_head_impl[uVar12 + 0xb] =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                     (cVar22 + -0x7c);
              }
              auVar84 = auVar59 ^ auVar3;
              iVar156 = -(uint)(iVar153 < auVar84._0_4_);
              auVar95._4_4_ = -(uint)(iVar154 < auVar84._4_4_);
              iVar172 = -(uint)(iVar155 < auVar84._8_4_);
              auVar95._12_4_ = -(uint)(iVar72 < auVar84._12_4_);
              auVar135._4_4_ = iVar156;
              auVar135._0_4_ = iVar156;
              auVar135._8_4_ = iVar172;
              auVar135._12_4_ = iVar172;
              auVar68 = pshuflw(auVar68,auVar135,0xe8);
              auVar94._4_4_ = -(uint)(auVar84._4_4_ == iVar154);
              auVar94._12_4_ = -(uint)(auVar84._12_4_ == iVar72);
              auVar94._0_4_ = auVar94._4_4_;
              auVar94._8_4_ = auVar94._12_4_;
              auVar179 = pshuflw(auVar182,auVar94,0xe8);
              auVar95._0_4_ = auVar95._4_4_;
              auVar95._8_4_ = auVar95._12_4_;
              auVar84 = pshuflw(auVar68,auVar95,0xe8);
              in_XMM14._8_4_ = 0xffffffff;
              in_XMM14._0_8_ = 0xffffffffffffffff;
              in_XMM14._12_4_ = 0xffffffff;
              auVar68 = (auVar84 | auVar179 & auVar68) ^ in_XMM14;
              auVar68 = packssdw(auVar68,auVar68);
              auVar68 = packsswb(auVar68,auVar68);
              if ((auVar68 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                local_38._M_head_impl[uVar12 + 0xc] =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                     (cVar22 + -0x7b);
              }
              auVar95 = auVar94 & auVar135 | auVar95;
              auVar68 = packssdw(auVar95,auVar95);
              auVar68 = packssdw(auVar68 ^ in_XMM14,auVar68 ^ in_XMM14);
              auVar68 = packsswb(auVar68,auVar68);
              if ((auVar68._12_2_ >> 8 & 1) != 0) {
                local_38._M_head_impl[uVar12 + 0xd] =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                     (cVar22 + -0x7a);
              }
              auVar68 = auVar63 ^ auVar3;
              auVar163._0_4_ = -(uint)(iVar153 < auVar68._0_4_);
              auVar163._4_4_ = -(uint)(iVar154 < auVar68._4_4_);
              auVar163._8_4_ = -(uint)(iVar155 < auVar68._8_4_);
              auVar163._12_4_ = -(uint)(iVar72 < auVar68._12_4_);
              auVar96._4_4_ = auVar163._0_4_;
              auVar96._0_4_ = auVar163._0_4_;
              auVar96._8_4_ = auVar163._8_4_;
              auVar96._12_4_ = auVar163._8_4_;
              iVar153 = -(uint)(auVar68._4_4_ == iVar154);
              iVar154 = -(uint)(auVar68._12_4_ == iVar72);
              auVar69._4_4_ = iVar153;
              auVar69._0_4_ = iVar153;
              auVar69._8_4_ = iVar154;
              auVar69._12_4_ = iVar154;
              auVar136._4_4_ = auVar163._4_4_;
              auVar136._0_4_ = auVar163._4_4_;
              auVar136._8_4_ = auVar163._12_4_;
              auVar136._12_4_ = auVar163._12_4_;
              in_XMM13 = auVar69 & auVar96 | auVar136;
              auVar68 = packssdw(auVar163,in_XMM13);
              auVar68 = packssdw(auVar68 ^ in_XMM14,auVar68 ^ in_XMM14);
              auVar68 = packsswb(auVar68,auVar68);
              if ((auVar68 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                local_38._M_head_impl[uVar12 + 0xe] =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                     (cVar22 + -0x79);
              }
              auVar84 = pshufhw(auVar96,auVar96,0x84);
              auVar68 = pshufhw(auVar69,auVar69,0x84);
              auVar179 = pshufhw(auVar84,auVar136,0x84);
              auVar68 = packssdw(auVar68 & auVar84,(auVar179 | auVar68 & auVar84) ^ in_XMM14);
              auVar68 = packsswb(auVar68,auVar68);
              if ((auVar68._14_2_ >> 8 & 1) != 0) {
                local_38._M_head_impl[uVar12 + 0xf] =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                     (cVar22 + -0x78);
              }
              uVar12 = uVar12 + 0x10;
              lVar7 = auVar23._8_8_;
              auVar23._0_8_ = auVar23._0_8_ + 0x10;
              auVar23._8_8_ = lVar7 + 0x10;
              lVar7 = auVar41._8_8_;
              auVar41._0_8_ = auVar41._0_8_ + 0x10;
              auVar41._8_8_ = lVar7 + 0x10;
              lVar7 = auVar44._8_8_;
              auVar44._0_8_ = auVar44._0_8_ + 0x10;
              auVar44._8_8_ = lVar7 + 0x10;
              lVar7 = auVar47._8_8_;
              auVar47._0_8_ = auVar47._0_8_ + 0x10;
              auVar47._8_8_ = lVar7 + 0x10;
              lVar7 = auVar51._8_8_;
              auVar51._0_8_ = auVar51._0_8_ + 0x10;
              auVar51._8_8_ = lVar7 + 0x10;
              lVar7 = auVar55._8_8_;
              auVar55._0_8_ = auVar55._0_8_ + 0x10;
              auVar55._8_8_ = lVar7 + 0x10;
              lVar7 = auVar59._8_8_;
              auVar59._0_8_ = auVar59._0_8_ + 0x10;
              auVar59._8_8_ = lVar7 + 0x10;
              lVar7 = auVar63._8_8_;
              auVar63._0_8_ = auVar63._0_8_ + 0x10;
              auVar63._8_8_ = lVar7 + 0x10;
            } while ((iVar5 + 0xfU & 0xfffffff0) != uVar12);
          }
          if (iVar5 < 1) {
LAB_001094f6:
            if (bVar15) {
              free(local_38._M_head_impl);
              goto LAB_00109507;
            }
          }
          else if (*local_38._M_head_impl ==
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0x79) {
            uVar12 = 1;
            do {
              uVar10 = uVar12;
              if (uVar13 == uVar10) break;
              uVar12 = uVar10 + 1;
            } while ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)
                     ((char)(uVar10 + 1) + 'x') == local_38._M_head_impl[uVar10]);
            bVar15 = uVar13 <= uVar10;
            goto LAB_001094f6;
          }
          pcVar6 = "Check failed: Valid(ptr, s, \'y\')\n";
          goto LAB_0010a8c5;
        }
        pcVar6 = "Check failed: posix_memalign(&ptr, a, s) == 0\n";
        uVar11 = 0x2e;
        goto LAB_0010a8cf;
      }
LAB_00109507:
      if (iVar5 < 100) {
        iVar153 = iVar5 + 1;
      }
      else {
        iVar153 = -1;
        if (iVar5 < 0x100000) {
          iVar153 = 1;
          do {
            iVar154 = iVar153;
            iVar153 = iVar154 * 2;
          } while (iVar154 < iVar5);
          iVar153 = iVar154 + -1;
          if (iVar153 <= iVar5) {
            iVar153 = iVar154 + (uint)(iVar153 != iVar5);
          }
        }
      }
      iVar5 = iVar153;
      bVar17 = iVar5 == -1;
    } while (!bVar17);
    bVar17 = uVar9 < 0x80000;
    bVar16 = !bVar17;
    uVar9 = uVar9 * 2;
  } while (bVar17);
LAB_0010963c:
  pcVar6 = (char *)memalign(0x100000,0x80000);
  __ptr = (char *)memalign(0x80000,0x80000);
  __ptr_00 = (char *)memalign(0x200000,0x80000);
  local_38._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )((ulong)gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_50,"Misallignment(p1, 1<<20)","0",(unsigned_long *)&local_38,
             (int *)&gtest_ar.message_);
  if (local_50._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/memalign_unittest.cc"
               ,0x98,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
LAB_0010a87c:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (gtest_ar._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar._0_8_);
    }
    return;
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_38._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )((ulong)gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_50,"Misallignment(p2, 1<<19)","0",(unsigned_long *)&local_38,
             (int *)&gtest_ar.message_);
  if (local_50._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/memalign_unittest.cc"
               ,0x99,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
    goto LAB_0010a87c;
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_38._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )((ulong)gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_50,"Misallignment(p3, 1<<21)","0",(unsigned_long *)&local_38,
             (int *)&gtest_ar.message_);
  if (local_50._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/memalign_unittest.cc"
               ,0x9a,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
    goto LAB_0010a87c;
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  cVar22 = '\0';
  cVar26 = '\x01';
  cVar27 = '\x02';
  cVar28 = '\x03';
  cVar29 = '\x04';
  cVar30 = '\x05';
  cVar31 = '\x06';
  cVar32 = '\a';
  cVar33 = '\b';
  cVar34 = '\t';
  cVar35 = '\n';
  cVar36 = '\v';
  cVar37 = '\f';
  cVar38 = '\r';
  cVar39 = '\x0e';
  cVar40 = '\x0f';
  lVar7 = 0;
  do {
    pcVar2 = pcVar6 + lVar7;
    *pcVar2 = cVar22 + 'a';
    pcVar2[1] = cVar26 + 'a';
    pcVar2[2] = cVar27 + 'a';
    pcVar2[3] = cVar28 + 'a';
    pcVar2[4] = cVar29 + 'a';
    pcVar2[5] = cVar30 + 'a';
    pcVar2[6] = cVar31 + 'a';
    pcVar2[7] = cVar32 + 'a';
    pcVar2[8] = cVar33 + 'a';
    pcVar2[9] = cVar34 + 'a';
    pcVar2[10] = cVar35 + 'a';
    pcVar2[0xb] = cVar36 + 'a';
    pcVar2[0xc] = cVar37 + 'a';
    pcVar2[0xd] = cVar38 + 'a';
    pcVar2[0xe] = cVar39 + 'a';
    pcVar2[0xf] = cVar40 + 'a';
    lVar7 = lVar7 + 0x10;
    cVar22 = cVar22 + '\x10';
    cVar26 = cVar26 + '\x10';
    cVar27 = cVar27 + '\x10';
    cVar28 = cVar28 + '\x10';
    cVar29 = cVar29 + '\x10';
    cVar30 = cVar30 + '\x10';
    cVar31 = cVar31 + '\x10';
    cVar32 = cVar32 + '\x10';
    cVar33 = cVar33 + '\x10';
    cVar34 = cVar34 + '\x10';
    cVar35 = cVar35 + '\x10';
    cVar36 = cVar36 + '\x10';
    cVar37 = cVar37 + '\x10';
    cVar38 = cVar38 + '\x10';
    cVar39 = cVar39 + '\x10';
    cVar40 = cVar40 + '\x10';
  } while (lVar7 != 0x80000);
  cVar22 = '\0';
  cVar26 = '\x01';
  cVar27 = '\x02';
  cVar28 = '\x03';
  cVar29 = '\x04';
  cVar30 = '\x05';
  cVar31 = '\x06';
  cVar32 = '\a';
  cVar33 = '\b';
  cVar34 = '\t';
  cVar35 = '\n';
  cVar36 = '\v';
  cVar37 = '\f';
  cVar38 = '\r';
  cVar39 = '\x0e';
  cVar40 = '\x0f';
  lVar7 = 0;
  do {
    pcVar2 = __ptr + lVar7;
    *pcVar2 = cVar22 + 'b';
    pcVar2[1] = cVar26 + 'b';
    pcVar2[2] = cVar27 + 'b';
    pcVar2[3] = cVar28 + 'b';
    pcVar2[4] = cVar29 + 'b';
    pcVar2[5] = cVar30 + 'b';
    pcVar2[6] = cVar31 + 'b';
    pcVar2[7] = cVar32 + 'b';
    pcVar2[8] = cVar33 + 'b';
    pcVar2[9] = cVar34 + 'b';
    pcVar2[10] = cVar35 + 'b';
    pcVar2[0xb] = cVar36 + 'b';
    pcVar2[0xc] = cVar37 + 'b';
    pcVar2[0xd] = cVar38 + 'b';
    pcVar2[0xe] = cVar39 + 'b';
    pcVar2[0xf] = cVar40 + 'b';
    lVar7 = lVar7 + 0x10;
    cVar22 = cVar22 + '\x10';
    cVar26 = cVar26 + '\x10';
    cVar27 = cVar27 + '\x10';
    cVar28 = cVar28 + '\x10';
    cVar29 = cVar29 + '\x10';
    cVar30 = cVar30 + '\x10';
    cVar31 = cVar31 + '\x10';
    cVar32 = cVar32 + '\x10';
    cVar33 = cVar33 + '\x10';
    cVar34 = cVar34 + '\x10';
    cVar35 = cVar35 + '\x10';
    cVar36 = cVar36 + '\x10';
    cVar37 = cVar37 + '\x10';
    cVar38 = cVar38 + '\x10';
    cVar39 = cVar39 + '\x10';
    cVar40 = cVar40 + '\x10';
  } while (lVar7 != 0x80000);
  cVar22 = '\0';
  cVar26 = '\x01';
  cVar27 = '\x02';
  cVar28 = '\x03';
  cVar29 = '\x04';
  cVar30 = '\x05';
  cVar31 = '\x06';
  cVar32 = '\a';
  cVar33 = '\b';
  cVar34 = '\t';
  cVar35 = '\n';
  cVar36 = '\v';
  cVar37 = '\f';
  cVar38 = '\r';
  cVar39 = '\x0e';
  cVar40 = '\x0f';
  lVar7 = 0;
  do {
    pcVar2 = __ptr_00 + lVar7;
    *pcVar2 = cVar22 + 'c';
    pcVar2[1] = cVar26 + 'c';
    pcVar2[2] = cVar27 + 'c';
    pcVar2[3] = cVar28 + 'c';
    pcVar2[4] = cVar29 + 'c';
    pcVar2[5] = cVar30 + 'c';
    pcVar2[6] = cVar31 + 'c';
    pcVar2[7] = cVar32 + 'c';
    pcVar2[8] = cVar33 + 'c';
    pcVar2[9] = cVar34 + 'c';
    pcVar2[10] = cVar35 + 'c';
    pcVar2[0xb] = cVar36 + 'c';
    pcVar2[0xc] = cVar37 + 'c';
    pcVar2[0xd] = cVar38 + 'c';
    pcVar2[0xe] = cVar39 + 'c';
    pcVar2[0xf] = cVar40 + 'c';
    lVar7 = lVar7 + 0x10;
    cVar22 = cVar22 + '\x10';
    cVar26 = cVar26 + '\x10';
    cVar27 = cVar27 + '\x10';
    cVar28 = cVar28 + '\x10';
    cVar29 = cVar29 + '\x10';
    cVar30 = cVar30 + '\x10';
    cVar31 = cVar31 + '\x10';
    cVar32 = cVar32 + '\x10';
    cVar33 = cVar33 + '\x10';
    cVar34 = cVar34 + '\x10';
    cVar35 = cVar35 + '\x10';
    cVar36 = cVar36 + '\x10';
    cVar37 = cVar37 + '\x10';
    cVar38 = cVar38 + '\x10';
    cVar39 = cVar39 + '\x10';
    cVar40 = cVar40 + '\x10';
  } while (lVar7 != 0x80000);
  if (*pcVar6 == 'a') {
    uVar8 = 0;
    do {
      uVar13 = uVar8;
      if (uVar13 == 0x7ffff) break;
      uVar8 = uVar13 + 1;
    } while ((char)((char)(uVar13 + 1) + 'a') == pcVar6[uVar13 + 1]);
    if (uVar13 < 0x7ffff) goto LAB_0010a92c;
    if (*__ptr == 'b') {
      uVar8 = 0;
      do {
        uVar13 = uVar8;
        if (uVar13 == 0x7ffff) break;
        uVar8 = uVar13 + 1;
      } while ((char)((char)(uVar13 + 1) + 'b') == __ptr[uVar13 + 1]);
      if (uVar13 < 0x7ffff) goto LAB_0010a935;
      if (*__ptr_00 == 'c') {
        uVar8 = 0;
        do {
          uVar13 = uVar8;
          if (uVar13 == 0x7ffff) break;
          uVar8 = uVar13 + 1;
        } while ((char)((char)(uVar13 + 1) + 'c') == __ptr_00[uVar13 + 1]);
        if (0x7fffe < uVar13) {
          free(pcVar6);
          free(__ptr);
          free(__ptr_00);
          iVar5 = posix_memalign(&local_38._M_head_impl,0,1);
          if (iVar5 == 0x16) {
            iVar5 = posix_memalign(&local_38._M_head_impl,4,1);
            if (iVar5 == 0x16) {
              iVar5 = posix_memalign(&local_38._M_head_impl,9,1);
              if (iVar5 == 0x16) {
                iVar5 = posix_memalign(&local_38._M_head_impl,0x1001,1);
                if (iVar5 == 0x16) {
                  local_50 = malloc;
                  (*noopt_helper)(&local_50);
                  __ptr_01 = (void *)(*local_50)(0x400000);
                  if (__ptr_01 == (void *)0x0) {
                    TestBody();
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar.message_);
                    if (local_38._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_38._M_head_impl + 8))();
                    }
                    local_38._M_head_impl =
                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x0;
                    if (gtest_ar._0_8_ != 0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&gtest_ar,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)gtest_ar._0_8_);
                    }
                    _Unwind_Resume(extraout_RAX);
                  }
                  __size = 0xffffffffffffffff;
                  do {
                    iVar5 = posix_memalign(&local_38._M_head_impl,0x400,__size);
                    if (iVar5 != 0xc) {
                      pcVar6 = "Check failed: r == ENOMEM\n";
                      uVar11 = 0x1a;
                      goto LAB_0010a8cf;
                    }
                    __size = __size - 1;
                  } while (__size != 0xfffffffffffffff6);
                  free(__ptr_01);
                  iVar5 = getpagesize();
                  uVar9 = 0;
                  do {
                    pcVar6 = (char *)valloc((long)(int)uVar9);
                    local_38._M_head_impl =
                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         Misallignment(pcVar6,(long)iVar5);
                    gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                          )((ulong)gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl & 0xffffffff00000000);
                    testing::internal::CmpHelperEQ<unsigned_long,int>
                              ((internal *)&local_50,"Misallignment(p, pagesize)","0",
                               (unsigned_long *)&local_38,(int *)&gtest_ar.message_);
                    iVar4 = local_50._0_1_;
                    if (local_50._0_1_ == (internal)0x0) {
                      testing::Message::Message((Message *)&local_38);
                      if (gtest_ar._0_8_ == 0) {
                        pcVar6 = "";
                      }
                      else {
                        pcVar6 = *(char **)gtest_ar._0_8_;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/memalign_unittest.cc"
                                 ,0xc2,pcVar6);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
                      goto LAB_0010a87c;
                    }
                    if (gtest_ar._0_8_ != 0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&gtest_ar,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)gtest_ar._0_8_);
                    }
                    auVar3 = _DAT_00139090;
                    uVar8 = (ulong)uVar9;
                    if (0 < (int)uVar9) {
                      lVar7 = uVar8 - 1;
                      auVar20._8_4_ = (int)lVar7;
                      auVar20._0_8_ = lVar7;
                      auVar20._12_4_ = (int)((ulong)lVar7 >> 0x20);
                      uVar13 = 0;
                      auVar24 = _DAT_00139080;
                      auVar42 = _DAT_00139070;
                      auVar45 = _DAT_00139060;
                      auVar48 = _DAT_00139050;
                      auVar52 = _DAT_00139040;
                      auVar56 = _DAT_00139030;
                      auVar60 = _DAT_00139020;
                      auVar64 = _DAT_00139010;
                      do {
                        auVar68 = auVar20 ^ auVar3;
                        auVar84 = auVar24 ^ auVar3;
                        iVar153 = auVar68._0_4_;
                        iVar156 = -(uint)(iVar153 < auVar84._0_4_);
                        iVar154 = auVar68._4_4_;
                        auVar98._4_4_ = -(uint)(iVar154 < auVar84._4_4_);
                        iVar155 = auVar68._8_4_;
                        iVar172 = -(uint)(iVar155 < auVar84._8_4_);
                        iVar72 = auVar68._12_4_;
                        auVar98._12_4_ = -(uint)(iVar72 < auVar84._12_4_);
                        auVar137._4_4_ = iVar156;
                        auVar137._0_4_ = iVar156;
                        auVar137._8_4_ = iVar172;
                        auVar137._12_4_ = iVar172;
                        auVar68 = pshuflw(in_XMM13,auVar137,0xe8);
                        auVar97._4_4_ = -(uint)(auVar84._4_4_ == iVar154);
                        auVar97._12_4_ = -(uint)(auVar84._12_4_ == iVar72);
                        auVar97._0_4_ = auVar97._4_4_;
                        auVar97._8_4_ = auVar97._12_4_;
                        auVar179 = pshuflw(in_XMM14,auVar97,0xe8);
                        auVar98._0_4_ = auVar98._4_4_;
                        auVar98._8_4_ = auVar98._12_4_;
                        auVar84 = pshuflw(auVar68,auVar98,0xe8);
                        auVar183._8_4_ = 0xffffffff;
                        auVar183._0_8_ = 0xffffffffffffffff;
                        auVar183._12_4_ = 0xffffffff;
                        auVar68 = (auVar84 | auVar179 & auVar68) ^ auVar183;
                        auVar68 = packssdw(auVar68,auVar68);
                        cVar22 = (char)uVar13;
                        if ((auVar68 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          pcVar6[uVar13] = cVar22 + 'v';
                        }
                        auVar98 = auVar97 & auVar137 | auVar98;
                        auVar68 = packssdw(auVar98,auVar98);
                        auVar68 = packssdw(auVar68 ^ auVar183,auVar68 ^ auVar183);
                        auVar68 = packsswb(auVar68,auVar68);
                        if ((auVar68._0_4_ >> 8 & 1) != 0) {
                          pcVar6[uVar13 + 1] = cVar22 + 'w';
                        }
                        auVar68 = auVar42 ^ auVar3;
                        iVar156 = -(uint)(iVar153 < auVar68._0_4_);
                        auVar164._4_4_ = -(uint)(iVar154 < auVar68._4_4_);
                        iVar172 = -(uint)(iVar155 < auVar68._8_4_);
                        auVar164._12_4_ = -(uint)(iVar72 < auVar68._12_4_);
                        auVar99._4_4_ = iVar156;
                        auVar99._0_4_ = iVar156;
                        auVar99._8_4_ = iVar172;
                        auVar99._12_4_ = iVar172;
                        auVar138._4_4_ = -(uint)(auVar68._4_4_ == iVar154);
                        auVar138._12_4_ = -(uint)(auVar68._12_4_ == iVar72);
                        auVar138._0_4_ = auVar138._4_4_;
                        auVar138._8_4_ = auVar138._12_4_;
                        auVar164._0_4_ = auVar164._4_4_;
                        auVar164._8_4_ = auVar164._12_4_;
                        auVar68 = auVar138 & auVar99 | auVar164;
                        auVar68 = packssdw(auVar68,auVar68);
                        auVar68 = packssdw(auVar68 ^ auVar183,auVar68 ^ auVar183);
                        auVar68 = packsswb(auVar68,auVar68);
                        if ((auVar68._0_4_ >> 0x10 & 1) != 0) {
                          pcVar6[uVar13 + 2] = cVar22 + 'x';
                        }
                        auVar84 = pshufhw(auVar99,auVar99,0x84);
                        auVar130 = pshufhw(auVar138,auVar138,0x84);
                        auVar179 = pshufhw(auVar84,auVar164,0x84);
                        auVar84 = (auVar179 | auVar130 & auVar84) ^ auVar183;
                        auVar84 = packssdw(auVar84,auVar84);
                        auVar84 = packsswb(auVar84,auVar84);
                        if ((auVar84._0_4_ >> 0x18 & 1) != 0) {
                          pcVar6[uVar13 + 3] = cVar22 + 'y';
                        }
                        auVar84 = auVar45 ^ auVar3;
                        iVar156 = -(uint)(iVar153 < auVar84._0_4_);
                        auVar101._4_4_ = -(uint)(iVar154 < auVar84._4_4_);
                        iVar172 = -(uint)(iVar155 < auVar84._8_4_);
                        auVar101._12_4_ = -(uint)(iVar72 < auVar84._12_4_);
                        auVar139._4_4_ = iVar156;
                        auVar139._0_4_ = iVar156;
                        auVar139._8_4_ = iVar172;
                        auVar139._12_4_ = iVar172;
                        auVar68 = pshuflw(auVar68,auVar139,0xe8);
                        auVar100._4_4_ = -(uint)(auVar84._4_4_ == iVar154);
                        auVar100._12_4_ = -(uint)(auVar84._12_4_ == iVar72);
                        auVar100._0_4_ = auVar100._4_4_;
                        auVar100._8_4_ = auVar100._12_4_;
                        auVar179 = pshuflw(auVar183,auVar100,0xe8);
                        auVar101._0_4_ = auVar101._4_4_;
                        auVar101._8_4_ = auVar101._12_4_;
                        auVar84 = pshuflw(auVar68,auVar101,0xe8);
                        auVar184._8_4_ = 0xffffffff;
                        auVar184._0_8_ = 0xffffffffffffffff;
                        auVar184._12_4_ = 0xffffffff;
                        auVar68 = (auVar84 | auVar179 & auVar68) ^ auVar184;
                        auVar68 = packssdw(auVar68,auVar68);
                        auVar68 = packsswb(auVar68,auVar68);
                        if ((auVar68 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                          pcVar6[uVar13 + 4] = cVar22 + 'z';
                        }
                        auVar101 = auVar100 & auVar139 | auVar101;
                        auVar68 = packssdw(auVar101,auVar101);
                        auVar68 = packssdw(auVar68 ^ auVar184,auVar68 ^ auVar184);
                        auVar68 = packsswb(auVar68,auVar68);
                        if ((auVar68._4_2_ >> 8 & 1) != 0) {
                          pcVar6[uVar13 + 5] = cVar22 + '{';
                        }
                        auVar68 = auVar48 ^ auVar3;
                        iVar156 = -(uint)(iVar153 < auVar68._0_4_);
                        auVar165._4_4_ = -(uint)(iVar154 < auVar68._4_4_);
                        iVar172 = -(uint)(iVar155 < auVar68._8_4_);
                        auVar165._12_4_ = -(uint)(iVar72 < auVar68._12_4_);
                        auVar102._4_4_ = iVar156;
                        auVar102._0_4_ = iVar156;
                        auVar102._8_4_ = iVar172;
                        auVar102._12_4_ = iVar172;
                        auVar140._4_4_ = -(uint)(auVar68._4_4_ == iVar154);
                        auVar140._12_4_ = -(uint)(auVar68._12_4_ == iVar72);
                        auVar140._0_4_ = auVar140._4_4_;
                        auVar140._8_4_ = auVar140._12_4_;
                        auVar165._0_4_ = auVar165._4_4_;
                        auVar165._8_4_ = auVar165._12_4_;
                        auVar68 = auVar140 & auVar102 | auVar165;
                        auVar68 = packssdw(auVar68,auVar68);
                        auVar68 = packssdw(auVar68 ^ auVar184,auVar68 ^ auVar184);
                        auVar68 = packsswb(auVar68,auVar68);
                        if ((auVar68 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0)
                        {
                          pcVar6[uVar13 + 6] = cVar22 + '|';
                        }
                        auVar84 = pshufhw(auVar102,auVar102,0x84);
                        auVar130 = pshufhw(auVar140,auVar140,0x84);
                        auVar179 = pshufhw(auVar84,auVar165,0x84);
                        auVar84 = (auVar179 | auVar130 & auVar84) ^ auVar184;
                        auVar84 = packssdw(auVar84,auVar84);
                        auVar84 = packsswb(auVar84,auVar84);
                        if ((auVar84._6_2_ >> 8 & 1) != 0) {
                          pcVar6[uVar13 + 7] = cVar22 + '}';
                        }
                        auVar84 = auVar52 ^ auVar3;
                        iVar156 = -(uint)(iVar153 < auVar84._0_4_);
                        auVar104._4_4_ = -(uint)(iVar154 < auVar84._4_4_);
                        iVar172 = -(uint)(iVar155 < auVar84._8_4_);
                        auVar104._12_4_ = -(uint)(iVar72 < auVar84._12_4_);
                        auVar141._4_4_ = iVar156;
                        auVar141._0_4_ = iVar156;
                        auVar141._8_4_ = iVar172;
                        auVar141._12_4_ = iVar172;
                        auVar68 = pshuflw(auVar68,auVar141,0xe8);
                        auVar103._4_4_ = -(uint)(auVar84._4_4_ == iVar154);
                        auVar103._12_4_ = -(uint)(auVar84._12_4_ == iVar72);
                        auVar103._0_4_ = auVar103._4_4_;
                        auVar103._8_4_ = auVar103._12_4_;
                        auVar179 = pshuflw(auVar184,auVar103,0xe8);
                        auVar104._0_4_ = auVar104._4_4_;
                        auVar104._8_4_ = auVar104._12_4_;
                        auVar84 = pshuflw(auVar68,auVar104,0xe8);
                        auVar185._8_4_ = 0xffffffff;
                        auVar185._0_8_ = 0xffffffffffffffff;
                        auVar185._12_4_ = 0xffffffff;
                        auVar68 = (auVar84 | auVar179 & auVar68) ^ auVar185;
                        auVar68 = packssdw(auVar68,auVar68);
                        auVar68 = packsswb(auVar68,auVar68);
                        if ((auVar68 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          pcVar6[uVar13 + 8] = cVar22 + '~';
                        }
                        auVar104 = auVar103 & auVar141 | auVar104;
                        auVar68 = packssdw(auVar104,auVar104);
                        auVar68 = packssdw(auVar68 ^ auVar185,auVar68 ^ auVar185);
                        auVar68 = packsswb(auVar68,auVar68);
                        if ((auVar68._8_2_ >> 8 & 1) != 0) {
                          pcVar6[uVar13 + 9] = cVar22 + '\x7f';
                        }
                        auVar68 = auVar56 ^ auVar3;
                        iVar156 = -(uint)(iVar153 < auVar68._0_4_);
                        auVar166._4_4_ = -(uint)(iVar154 < auVar68._4_4_);
                        iVar172 = -(uint)(iVar155 < auVar68._8_4_);
                        auVar166._12_4_ = -(uint)(iVar72 < auVar68._12_4_);
                        auVar105._4_4_ = iVar156;
                        auVar105._0_4_ = iVar156;
                        auVar105._8_4_ = iVar172;
                        auVar105._12_4_ = iVar172;
                        auVar142._4_4_ = -(uint)(auVar68._4_4_ == iVar154);
                        auVar142._12_4_ = -(uint)(auVar68._12_4_ == iVar72);
                        auVar142._0_4_ = auVar142._4_4_;
                        auVar142._8_4_ = auVar142._12_4_;
                        auVar166._0_4_ = auVar166._4_4_;
                        auVar166._8_4_ = auVar166._12_4_;
                        auVar68 = auVar142 & auVar105 | auVar166;
                        auVar68 = packssdw(auVar68,auVar68);
                        auVar68 = packssdw(auVar68 ^ auVar185,auVar68 ^ auVar185);
                        auVar68 = packsswb(auVar68,auVar68);
                        if ((auVar68 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                          pcVar6[uVar13 + 10] = cVar22 + -0x80;
                        }
                        auVar84 = pshufhw(auVar105,auVar105,0x84);
                        auVar130 = pshufhw(auVar142,auVar142,0x84);
                        auVar179 = pshufhw(auVar84,auVar166,0x84);
                        auVar84 = (auVar179 | auVar130 & auVar84) ^ auVar185;
                        auVar84 = packssdw(auVar84,auVar84);
                        auVar84 = packsswb(auVar84,auVar84);
                        if ((auVar84._10_2_ >> 8 & 1) != 0) {
                          pcVar6[uVar13 + 0xb] = cVar22 + -0x7f;
                        }
                        auVar84 = auVar60 ^ auVar3;
                        iVar156 = -(uint)(iVar153 < auVar84._0_4_);
                        auVar107._4_4_ = -(uint)(iVar154 < auVar84._4_4_);
                        iVar172 = -(uint)(iVar155 < auVar84._8_4_);
                        auVar107._12_4_ = -(uint)(iVar72 < auVar84._12_4_);
                        auVar143._4_4_ = iVar156;
                        auVar143._0_4_ = iVar156;
                        auVar143._8_4_ = iVar172;
                        auVar143._12_4_ = iVar172;
                        auVar68 = pshuflw(auVar68,auVar143,0xe8);
                        auVar106._4_4_ = -(uint)(auVar84._4_4_ == iVar154);
                        auVar106._12_4_ = -(uint)(auVar84._12_4_ == iVar72);
                        auVar106._0_4_ = auVar106._4_4_;
                        auVar106._8_4_ = auVar106._12_4_;
                        auVar179 = pshuflw(auVar185,auVar106,0xe8);
                        auVar107._0_4_ = auVar107._4_4_;
                        auVar107._8_4_ = auVar107._12_4_;
                        auVar84 = pshuflw(auVar68,auVar107,0xe8);
                        in_XMM14._8_4_ = 0xffffffff;
                        in_XMM14._0_8_ = 0xffffffffffffffff;
                        in_XMM14._12_4_ = 0xffffffff;
                        auVar68 = (auVar84 | auVar179 & auVar68) ^ in_XMM14;
                        auVar68 = packssdw(auVar68,auVar68);
                        auVar68 = packsswb(auVar68,auVar68);
                        if ((auVar68 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                          pcVar6[uVar13 + 0xc] = cVar22 + -0x7e;
                        }
                        auVar107 = auVar106 & auVar143 | auVar107;
                        auVar68 = packssdw(auVar107,auVar107);
                        auVar68 = packssdw(auVar68 ^ in_XMM14,auVar68 ^ in_XMM14);
                        auVar68 = packsswb(auVar68,auVar68);
                        if ((auVar68._12_2_ >> 8 & 1) != 0) {
                          pcVar6[uVar13 + 0xd] = cVar22 + -0x7d;
                        }
                        auVar68 = auVar64 ^ auVar3;
                        auVar167._0_4_ = -(uint)(iVar153 < auVar68._0_4_);
                        auVar167._4_4_ = -(uint)(iVar154 < auVar68._4_4_);
                        auVar167._8_4_ = -(uint)(iVar155 < auVar68._8_4_);
                        auVar167._12_4_ = -(uint)(iVar72 < auVar68._12_4_);
                        auVar108._4_4_ = auVar167._0_4_;
                        auVar108._0_4_ = auVar167._0_4_;
                        auVar108._8_4_ = auVar167._8_4_;
                        auVar108._12_4_ = auVar167._8_4_;
                        iVar153 = -(uint)(auVar68._4_4_ == iVar154);
                        iVar154 = -(uint)(auVar68._12_4_ == iVar72);
                        auVar70._4_4_ = iVar153;
                        auVar70._0_4_ = iVar153;
                        auVar70._8_4_ = iVar154;
                        auVar70._12_4_ = iVar154;
                        auVar144._4_4_ = auVar167._4_4_;
                        auVar144._0_4_ = auVar167._4_4_;
                        auVar144._8_4_ = auVar167._12_4_;
                        auVar144._12_4_ = auVar167._12_4_;
                        in_XMM13 = auVar70 & auVar108 | auVar144;
                        auVar68 = packssdw(auVar167,in_XMM13);
                        auVar68 = packssdw(auVar68 ^ in_XMM14,auVar68 ^ in_XMM14);
                        auVar68 = packsswb(auVar68,auVar68);
                        if ((auVar68 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0)
                        {
                          pcVar6[uVar13 + 0xe] = cVar22 + -0x7c;
                        }
                        auVar84 = pshufhw(auVar108,auVar108,0x84);
                        auVar68 = pshufhw(auVar70,auVar70,0x84);
                        auVar179 = pshufhw(auVar84,auVar144,0x84);
                        auVar68 = packssdw(auVar68 & auVar84,
                                           (auVar179 | auVar68 & auVar84) ^ in_XMM14);
                        auVar68 = packsswb(auVar68,auVar68);
                        if ((auVar68._14_2_ >> 8 & 1) != 0) {
                          pcVar6[uVar13 + 0xf] = cVar22 + -0x7b;
                        }
                        uVar13 = uVar13 + 0x10;
                        lVar7 = auVar24._8_8_;
                        auVar24._0_8_ = auVar24._0_8_ + 0x10;
                        auVar24._8_8_ = lVar7 + 0x10;
                        lVar7 = auVar42._8_8_;
                        auVar42._0_8_ = auVar42._0_8_ + 0x10;
                        auVar42._8_8_ = lVar7 + 0x10;
                        lVar7 = auVar45._8_8_;
                        auVar45._0_8_ = auVar45._0_8_ + 0x10;
                        auVar45._8_8_ = lVar7 + 0x10;
                        lVar7 = auVar48._8_8_;
                        auVar48._0_8_ = auVar48._0_8_ + 0x10;
                        auVar48._8_8_ = lVar7 + 0x10;
                        lVar7 = auVar52._8_8_;
                        auVar52._0_8_ = auVar52._0_8_ + 0x10;
                        auVar52._8_8_ = lVar7 + 0x10;
                        lVar7 = auVar56._8_8_;
                        auVar56._0_8_ = auVar56._0_8_ + 0x10;
                        auVar56._8_8_ = lVar7 + 0x10;
                        lVar7 = auVar60._8_8_;
                        auVar60._0_8_ = auVar60._0_8_ + 0x10;
                        auVar60._8_8_ = lVar7 + 0x10;
                        lVar7 = auVar64._8_8_;
                        auVar64._0_8_ = auVar64._0_8_ + 0x10;
                        auVar64._8_8_ = lVar7 + 0x10;
                      } while ((uVar9 + 0xf & 0xfffffff0) != uVar13);
                    }
                    bVar16 = (int)uVar9 < 1;
                    if (0 < (int)uVar9) {
                      if (*pcVar6 == 'v') {
                        uVar13 = 1;
                        do {
                          uVar12 = uVar13;
                          if (uVar8 == uVar12) break;
                          uVar13 = uVar12 + 1;
                        } while ((char)((char)(uVar12 + 1) + 'u') == pcVar6[uVar12]);
                        bVar16 = uVar8 <= uVar12;
                        goto LAB_00109fd1;
                      }
LAB_0010a906:
                      pcVar6 = "Check failed: Valid(p, s, \'v\')\n";
                      uVar11 = 0x1f;
                      goto LAB_0010a8cf;
                    }
LAB_00109fd1:
                    if (!bVar16) goto LAB_0010a906;
                    free(pcVar6);
                    if (iVar4 == (internal)0x0) {
                      return;
                    }
                    if ((int)uVar9 < 100) {
                      uVar1 = uVar9 + 1;
                    }
                    else {
                      uVar1 = 0xffffffff;
                      if ((int)uVar9 < 0x100000) {
                        iVar153 = 1;
                        do {
                          iVar154 = iVar153;
                          iVar153 = iVar154 * 2;
                        } while (iVar154 < (int)uVar9);
                        uVar1 = iVar154 - 1;
                        if ((int)uVar1 <= (int)uVar9) {
                          uVar1 = iVar154 + (uint)(uVar1 != uVar9);
                        }
                      }
                    }
                    uVar9 = uVar1;
                  } while (uVar9 != 0xffffffff);
                  iVar153 = 0;
                  while( true ) {
                    pcVar6 = (char *)pvalloc((long)iVar153);
                    local_38._M_head_impl =
                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         Misallignment(pcVar6,(long)iVar5);
                    gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                          )((ulong)gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl & 0xffffffff00000000);
                    testing::internal::CmpHelperEQ<unsigned_long,int>
                              ((internal *)&local_50,"Misallignment(p, pagesize)","0",
                               (unsigned_long *)&local_38,(int *)&gtest_ar.message_);
                    iVar4 = local_50._0_1_;
                    if (local_50._0_1_ == (internal)0x0) break;
                    if (gtest_ar._0_8_ != 0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&gtest_ar,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)gtest_ar._0_8_);
                    }
                    auVar3 = _DAT_00139090;
                    iVar154 = iVar153 + iVar5 + -1;
                    uVar9 = iVar154 - iVar154 % iVar5;
                    uVar8 = (ulong)uVar9;
                    if (uVar9 != 0 && iVar154 % iVar5 <= iVar154) {
                      lVar7 = uVar8 - 1;
                      auVar21._8_4_ = (int)lVar7;
                      auVar21._0_8_ = lVar7;
                      auVar21._12_4_ = (int)((ulong)lVar7 >> 0x20);
                      uVar13 = 0;
                      auVar25 = _DAT_00139080;
                      auVar43 = _DAT_00139070;
                      auVar46 = _DAT_00139060;
                      auVar49 = _DAT_00139050;
                      auVar53 = _DAT_00139040;
                      auVar57 = _DAT_00139030;
                      auVar61 = _DAT_00139020;
                      auVar65 = _DAT_00139010;
                      do {
                        auVar68 = auVar21 ^ auVar3;
                        auVar84 = auVar25 ^ auVar3;
                        iVar154 = auVar68._0_4_;
                        iVar172 = -(uint)(iVar154 < auVar84._0_4_);
                        iVar155 = auVar68._4_4_;
                        auVar110._4_4_ = -(uint)(iVar155 < auVar84._4_4_);
                        iVar72 = auVar68._8_4_;
                        iVar173 = -(uint)(iVar72 < auVar84._8_4_);
                        iVar156 = auVar68._12_4_;
                        auVar110._12_4_ = -(uint)(iVar156 < auVar84._12_4_);
                        auVar145._4_4_ = iVar172;
                        auVar145._0_4_ = iVar172;
                        auVar145._8_4_ = iVar173;
                        auVar145._12_4_ = iVar173;
                        auVar68 = pshuflw(in_XMM13,auVar145,0xe8);
                        auVar109._4_4_ = -(uint)(auVar84._4_4_ == iVar155);
                        auVar109._12_4_ = -(uint)(auVar84._12_4_ == iVar156);
                        auVar109._0_4_ = auVar109._4_4_;
                        auVar109._8_4_ = auVar109._12_4_;
                        auVar179 = pshuflw(in_XMM14,auVar109,0xe8);
                        auVar110._0_4_ = auVar110._4_4_;
                        auVar110._8_4_ = auVar110._12_4_;
                        auVar84 = pshuflw(auVar68,auVar110,0xe8);
                        auVar186._8_4_ = 0xffffffff;
                        auVar186._0_8_ = 0xffffffffffffffff;
                        auVar186._12_4_ = 0xffffffff;
                        auVar68 = (auVar84 | auVar179 & auVar68) ^ auVar186;
                        auVar68 = packssdw(auVar68,auVar68);
                        cVar22 = (char)uVar13;
                        if ((auVar68 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          pcVar6[uVar13] = cVar22 + 'x';
                        }
                        auVar110 = auVar109 & auVar145 | auVar110;
                        auVar68 = packssdw(auVar110,auVar110);
                        auVar68 = packssdw(auVar68 ^ auVar186,auVar68 ^ auVar186);
                        auVar68 = packsswb(auVar68,auVar68);
                        if ((auVar68._0_4_ >> 8 & 1) != 0) {
                          pcVar6[uVar13 + 1] = cVar22 + 'y';
                        }
                        auVar68 = auVar43 ^ auVar3;
                        iVar172 = -(uint)(iVar154 < auVar68._0_4_);
                        auVar168._4_4_ = -(uint)(iVar155 < auVar68._4_4_);
                        iVar173 = -(uint)(iVar72 < auVar68._8_4_);
                        auVar168._12_4_ = -(uint)(iVar156 < auVar68._12_4_);
                        auVar111._4_4_ = iVar172;
                        auVar111._0_4_ = iVar172;
                        auVar111._8_4_ = iVar173;
                        auVar111._12_4_ = iVar173;
                        auVar146._4_4_ = -(uint)(auVar68._4_4_ == iVar155);
                        auVar146._12_4_ = -(uint)(auVar68._12_4_ == iVar156);
                        auVar146._0_4_ = auVar146._4_4_;
                        auVar146._8_4_ = auVar146._12_4_;
                        auVar168._0_4_ = auVar168._4_4_;
                        auVar168._8_4_ = auVar168._12_4_;
                        auVar68 = auVar146 & auVar111 | auVar168;
                        auVar68 = packssdw(auVar68,auVar68);
                        auVar68 = packssdw(auVar68 ^ auVar186,auVar68 ^ auVar186);
                        auVar68 = packsswb(auVar68,auVar68);
                        if ((auVar68._0_4_ >> 0x10 & 1) != 0) {
                          pcVar6[uVar13 + 2] = cVar22 + 'z';
                        }
                        auVar84 = pshufhw(auVar111,auVar111,0x84);
                        auVar130 = pshufhw(auVar146,auVar146,0x84);
                        auVar179 = pshufhw(auVar84,auVar168,0x84);
                        auVar84 = (auVar179 | auVar130 & auVar84) ^ auVar186;
                        auVar84 = packssdw(auVar84,auVar84);
                        auVar84 = packsswb(auVar84,auVar84);
                        if ((auVar84._0_4_ >> 0x18 & 1) != 0) {
                          pcVar6[uVar13 + 3] = cVar22 + '{';
                        }
                        auVar84 = auVar46 ^ auVar3;
                        iVar172 = -(uint)(iVar154 < auVar84._0_4_);
                        auVar113._4_4_ = -(uint)(iVar155 < auVar84._4_4_);
                        iVar173 = -(uint)(iVar72 < auVar84._8_4_);
                        auVar113._12_4_ = -(uint)(iVar156 < auVar84._12_4_);
                        auVar147._4_4_ = iVar172;
                        auVar147._0_4_ = iVar172;
                        auVar147._8_4_ = iVar173;
                        auVar147._12_4_ = iVar173;
                        auVar68 = pshuflw(auVar68,auVar147,0xe8);
                        auVar112._4_4_ = -(uint)(auVar84._4_4_ == iVar155);
                        auVar112._12_4_ = -(uint)(auVar84._12_4_ == iVar156);
                        auVar112._0_4_ = auVar112._4_4_;
                        auVar112._8_4_ = auVar112._12_4_;
                        auVar179 = pshuflw(auVar186,auVar112,0xe8);
                        auVar113._0_4_ = auVar113._4_4_;
                        auVar113._8_4_ = auVar113._12_4_;
                        auVar84 = pshuflw(auVar68,auVar113,0xe8);
                        auVar187._8_4_ = 0xffffffff;
                        auVar187._0_8_ = 0xffffffffffffffff;
                        auVar187._12_4_ = 0xffffffff;
                        auVar68 = (auVar84 | auVar179 & auVar68) ^ auVar187;
                        auVar68 = packssdw(auVar68,auVar68);
                        auVar68 = packsswb(auVar68,auVar68);
                        if ((auVar68 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                          pcVar6[uVar13 + 4] = cVar22 + '|';
                        }
                        auVar113 = auVar112 & auVar147 | auVar113;
                        auVar68 = packssdw(auVar113,auVar113);
                        auVar68 = packssdw(auVar68 ^ auVar187,auVar68 ^ auVar187);
                        auVar68 = packsswb(auVar68,auVar68);
                        if ((auVar68._4_2_ >> 8 & 1) != 0) {
                          pcVar6[uVar13 + 5] = cVar22 + '}';
                        }
                        auVar68 = auVar49 ^ auVar3;
                        iVar172 = -(uint)(iVar154 < auVar68._0_4_);
                        auVar169._4_4_ = -(uint)(iVar155 < auVar68._4_4_);
                        iVar173 = -(uint)(iVar72 < auVar68._8_4_);
                        auVar169._12_4_ = -(uint)(iVar156 < auVar68._12_4_);
                        auVar114._4_4_ = iVar172;
                        auVar114._0_4_ = iVar172;
                        auVar114._8_4_ = iVar173;
                        auVar114._12_4_ = iVar173;
                        auVar148._4_4_ = -(uint)(auVar68._4_4_ == iVar155);
                        auVar148._12_4_ = -(uint)(auVar68._12_4_ == iVar156);
                        auVar148._0_4_ = auVar148._4_4_;
                        auVar148._8_4_ = auVar148._12_4_;
                        auVar169._0_4_ = auVar169._4_4_;
                        auVar169._8_4_ = auVar169._12_4_;
                        auVar68 = auVar148 & auVar114 | auVar169;
                        auVar68 = packssdw(auVar68,auVar68);
                        auVar68 = packssdw(auVar68 ^ auVar187,auVar68 ^ auVar187);
                        auVar68 = packsswb(auVar68,auVar68);
                        if ((auVar68 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0)
                        {
                          pcVar6[uVar13 + 6] = cVar22 + '~';
                        }
                        auVar84 = pshufhw(auVar114,auVar114,0x84);
                        auVar130 = pshufhw(auVar148,auVar148,0x84);
                        auVar179 = pshufhw(auVar84,auVar169,0x84);
                        auVar84 = (auVar179 | auVar130 & auVar84) ^ auVar187;
                        auVar84 = packssdw(auVar84,auVar84);
                        auVar84 = packsswb(auVar84,auVar84);
                        if ((auVar84._6_2_ >> 8 & 1) != 0) {
                          pcVar6[uVar13 + 7] = cVar22 + '\x7f';
                        }
                        auVar84 = auVar53 ^ auVar3;
                        iVar172 = -(uint)(iVar154 < auVar84._0_4_);
                        auVar116._4_4_ = -(uint)(iVar155 < auVar84._4_4_);
                        iVar173 = -(uint)(iVar72 < auVar84._8_4_);
                        auVar116._12_4_ = -(uint)(iVar156 < auVar84._12_4_);
                        auVar149._4_4_ = iVar172;
                        auVar149._0_4_ = iVar172;
                        auVar149._8_4_ = iVar173;
                        auVar149._12_4_ = iVar173;
                        auVar68 = pshuflw(auVar68,auVar149,0xe8);
                        auVar115._4_4_ = -(uint)(auVar84._4_4_ == iVar155);
                        auVar115._12_4_ = -(uint)(auVar84._12_4_ == iVar156);
                        auVar115._0_4_ = auVar115._4_4_;
                        auVar115._8_4_ = auVar115._12_4_;
                        auVar179 = pshuflw(auVar187,auVar115,0xe8);
                        auVar116._0_4_ = auVar116._4_4_;
                        auVar116._8_4_ = auVar116._12_4_;
                        auVar84 = pshuflw(auVar68,auVar116,0xe8);
                        auVar188._8_4_ = 0xffffffff;
                        auVar188._0_8_ = 0xffffffffffffffff;
                        auVar188._12_4_ = 0xffffffff;
                        auVar68 = (auVar84 | auVar179 & auVar68) ^ auVar188;
                        auVar68 = packssdw(auVar68,auVar68);
                        auVar68 = packsswb(auVar68,auVar68);
                        if ((auVar68 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          pcVar6[uVar13 + 8] = cVar22 + -0x80;
                        }
                        auVar116 = auVar115 & auVar149 | auVar116;
                        auVar68 = packssdw(auVar116,auVar116);
                        auVar68 = packssdw(auVar68 ^ auVar188,auVar68 ^ auVar188);
                        auVar68 = packsswb(auVar68,auVar68);
                        if ((auVar68._8_2_ >> 8 & 1) != 0) {
                          pcVar6[uVar13 + 9] = cVar22 + -0x7f;
                        }
                        auVar68 = auVar57 ^ auVar3;
                        iVar172 = -(uint)(iVar154 < auVar68._0_4_);
                        auVar170._4_4_ = -(uint)(iVar155 < auVar68._4_4_);
                        iVar173 = -(uint)(iVar72 < auVar68._8_4_);
                        auVar170._12_4_ = -(uint)(iVar156 < auVar68._12_4_);
                        auVar117._4_4_ = iVar172;
                        auVar117._0_4_ = iVar172;
                        auVar117._8_4_ = iVar173;
                        auVar117._12_4_ = iVar173;
                        auVar150._4_4_ = -(uint)(auVar68._4_4_ == iVar155);
                        auVar150._12_4_ = -(uint)(auVar68._12_4_ == iVar156);
                        auVar150._0_4_ = auVar150._4_4_;
                        auVar150._8_4_ = auVar150._12_4_;
                        auVar170._0_4_ = auVar170._4_4_;
                        auVar170._8_4_ = auVar170._12_4_;
                        auVar68 = auVar150 & auVar117 | auVar170;
                        auVar68 = packssdw(auVar68,auVar68);
                        auVar68 = packssdw(auVar68 ^ auVar188,auVar68 ^ auVar188);
                        auVar68 = packsswb(auVar68,auVar68);
                        if ((auVar68 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                          pcVar6[uVar13 + 10] = cVar22 + -0x7e;
                        }
                        auVar84 = pshufhw(auVar117,auVar117,0x84);
                        auVar130 = pshufhw(auVar150,auVar150,0x84);
                        auVar179 = pshufhw(auVar84,auVar170,0x84);
                        auVar84 = (auVar179 | auVar130 & auVar84) ^ auVar188;
                        auVar84 = packssdw(auVar84,auVar84);
                        auVar84 = packsswb(auVar84,auVar84);
                        if ((auVar84._10_2_ >> 8 & 1) != 0) {
                          pcVar6[uVar13 + 0xb] = cVar22 + -0x7d;
                        }
                        auVar84 = auVar61 ^ auVar3;
                        iVar172 = -(uint)(iVar154 < auVar84._0_4_);
                        auVar119._4_4_ = -(uint)(iVar155 < auVar84._4_4_);
                        iVar173 = -(uint)(iVar72 < auVar84._8_4_);
                        auVar119._12_4_ = -(uint)(iVar156 < auVar84._12_4_);
                        auVar151._4_4_ = iVar172;
                        auVar151._0_4_ = iVar172;
                        auVar151._8_4_ = iVar173;
                        auVar151._12_4_ = iVar173;
                        auVar68 = pshuflw(auVar68,auVar151,0xe8);
                        auVar118._4_4_ = -(uint)(auVar84._4_4_ == iVar155);
                        auVar118._12_4_ = -(uint)(auVar84._12_4_ == iVar156);
                        auVar118._0_4_ = auVar118._4_4_;
                        auVar118._8_4_ = auVar118._12_4_;
                        auVar179 = pshuflw(auVar188,auVar118,0xe8);
                        auVar119._0_4_ = auVar119._4_4_;
                        auVar119._8_4_ = auVar119._12_4_;
                        auVar84 = pshuflw(auVar68,auVar119,0xe8);
                        in_XMM14._8_4_ = 0xffffffff;
                        in_XMM14._0_8_ = 0xffffffffffffffff;
                        in_XMM14._12_4_ = 0xffffffff;
                        auVar68 = (auVar84 | auVar179 & auVar68) ^ in_XMM14;
                        auVar68 = packssdw(auVar68,auVar68);
                        auVar68 = packsswb(auVar68,auVar68);
                        if ((auVar68 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                          pcVar6[uVar13 + 0xc] = cVar22 + -0x7c;
                        }
                        auVar119 = auVar118 & auVar151 | auVar119;
                        auVar68 = packssdw(auVar119,auVar119);
                        auVar68 = packssdw(auVar68 ^ in_XMM14,auVar68 ^ in_XMM14);
                        auVar68 = packsswb(auVar68,auVar68);
                        if ((auVar68._12_2_ >> 8 & 1) != 0) {
                          pcVar6[uVar13 + 0xd] = cVar22 + -0x7b;
                        }
                        auVar68 = auVar65 ^ auVar3;
                        auVar171._0_4_ = -(uint)(iVar154 < auVar68._0_4_);
                        auVar171._4_4_ = -(uint)(iVar155 < auVar68._4_4_);
                        auVar171._8_4_ = -(uint)(iVar72 < auVar68._8_4_);
                        auVar171._12_4_ = -(uint)(iVar156 < auVar68._12_4_);
                        auVar120._4_4_ = auVar171._0_4_;
                        auVar120._0_4_ = auVar171._0_4_;
                        auVar120._8_4_ = auVar171._8_4_;
                        auVar120._12_4_ = auVar171._8_4_;
                        iVar154 = -(uint)(auVar68._4_4_ == iVar155);
                        iVar155 = -(uint)(auVar68._12_4_ == iVar156);
                        auVar71._4_4_ = iVar154;
                        auVar71._0_4_ = iVar154;
                        auVar71._8_4_ = iVar155;
                        auVar71._12_4_ = iVar155;
                        auVar152._4_4_ = auVar171._4_4_;
                        auVar152._0_4_ = auVar171._4_4_;
                        auVar152._8_4_ = auVar171._12_4_;
                        auVar152._12_4_ = auVar171._12_4_;
                        in_XMM13 = auVar71 & auVar120 | auVar152;
                        auVar68 = packssdw(auVar171,in_XMM13);
                        auVar68 = packssdw(auVar68 ^ in_XMM14,auVar68 ^ in_XMM14);
                        auVar68 = packsswb(auVar68,auVar68);
                        if ((auVar68 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0)
                        {
                          pcVar6[uVar13 + 0xe] = cVar22 + -0x7a;
                        }
                        auVar84 = pshufhw(auVar120,auVar120,0x84);
                        auVar68 = pshufhw(auVar71,auVar71,0x84);
                        auVar179 = pshufhw(auVar84,auVar152,0x84);
                        auVar68 = packssdw(auVar68 & auVar84,
                                           (auVar179 | auVar68 & auVar84) ^ in_XMM14);
                        auVar68 = packsswb(auVar68,auVar68);
                        if ((auVar68._14_2_ >> 8 & 1) != 0) {
                          pcVar6[uVar13 + 0xf] = cVar22 + -0x79;
                        }
                        uVar13 = uVar13 + 0x10;
                        lVar7 = auVar25._8_8_;
                        auVar25._0_8_ = auVar25._0_8_ + 0x10;
                        auVar25._8_8_ = lVar7 + 0x10;
                        lVar7 = auVar43._8_8_;
                        auVar43._0_8_ = auVar43._0_8_ + 0x10;
                        auVar43._8_8_ = lVar7 + 0x10;
                        lVar7 = auVar46._8_8_;
                        auVar46._0_8_ = auVar46._0_8_ + 0x10;
                        auVar46._8_8_ = lVar7 + 0x10;
                        lVar7 = auVar49._8_8_;
                        auVar49._0_8_ = auVar49._0_8_ + 0x10;
                        auVar49._8_8_ = lVar7 + 0x10;
                        lVar7 = auVar53._8_8_;
                        auVar53._0_8_ = auVar53._0_8_ + 0x10;
                        auVar53._8_8_ = lVar7 + 0x10;
                        lVar7 = auVar57._8_8_;
                        auVar57._0_8_ = auVar57._0_8_ + 0x10;
                        auVar57._8_8_ = lVar7 + 0x10;
                        lVar7 = auVar61._8_8_;
                        auVar61._0_8_ = auVar61._0_8_ + 0x10;
                        auVar61._8_8_ = lVar7 + 0x10;
                        lVar7 = auVar65._8_8_;
                        auVar65._0_8_ = auVar65._0_8_ + 0x10;
                        auVar65._8_8_ = lVar7 + 0x10;
                      } while ((uVar9 + 0xf & 0xfffffff0) != uVar13);
                    }
                    bVar16 = (int)uVar9 < 1;
                    if (0 < (int)uVar9) {
                      if (*pcVar6 == 'x') {
                        uVar13 = 1;
                        do {
                          uVar12 = uVar13;
                          if (uVar8 == uVar12) break;
                          uVar13 = uVar12 + 1;
                        } while ((char)((char)(uVar12 + 1) + 'w') == pcVar6[uVar12]);
                        bVar16 = uVar8 <= uVar12;
                        goto LAB_0010a7a0;
                      }
LAB_0010a919:
                      pcVar6 = "Check failed: Valid(p, alloc_needed, \'x\')\n";
                      uVar11 = 0x2a;
                      goto LAB_0010a8cf;
                    }
LAB_0010a7a0:
                    if (!bVar16) goto LAB_0010a919;
                    free(pcVar6);
                    if (iVar4 == (internal)0x0) {
                      return;
                    }
                    if (iVar153 < 100) {
                      iVar154 = iVar153 + 1;
                    }
                    else {
                      iVar154 = -1;
                      if (iVar153 < 0x100000) {
                        iVar154 = 1;
                        do {
                          iVar155 = iVar154;
                          iVar154 = iVar155 * 2;
                        } while (iVar155 < iVar153);
                        iVar154 = iVar155 + -1;
                        if (iVar154 <= iVar153) {
                          iVar154 = iVar155 + (uint)(iVar154 != iVar153);
                        }
                      }
                    }
                    iVar153 = iVar154;
                    if (iVar153 == -1) {
                      return;
                    }
                  }
                  testing::Message::Message((Message *)&local_38);
                  if (gtest_ar._0_8_ == 0) {
                    pcVar6 = "";
                  }
                  else {
                    pcVar6 = *(char **)gtest_ar._0_8_;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/memalign_unittest.cc"
                             ,0xcd,pcVar6);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar.message_,(Message *)&local_38);
                  goto LAB_0010a87c;
                }
                pcVar6 = "Check failed: posix_memalign(&ptr, 4097, 1) == EINVAL\n";
                uVar11 = 0x36;
                goto LAB_0010a8cf;
              }
              pcVar6 = "Check failed: posix_memalign(&ptr, sizeof(void*)+1, 1) == EINVAL\n";
            }
            else {
              pcVar6 = "Check failed: posix_memalign(&ptr, sizeof(void*)/2, 1) == EINVAL\n";
            }
            uVar11 = 0x41;
          }
          else {
            pcVar6 = "Check failed: posix_memalign(&ptr, 0, 1) == EINVAL\n";
            uVar11 = 0x33;
          }
          goto LAB_0010a8cf;
        }
      }
      pcVar6 = "Check failed: Valid(p3, 1<<19, \'c\')\n";
    }
    else {
LAB_0010a935:
      pcVar6 = "Check failed: Valid(p2, 1<<19, \'b\')\n";
    }
  }
  else {
LAB_0010a92c:
    pcVar6 = "Check failed: Valid(p1, 1<<19, \'a\')\n";
  }
  uVar11 = 0x24;
LAB_0010a8cf:
  syscall(1,2,pcVar6,uVar11);
  abort();
}

Assistant:

TEST(MemalignTest, Basic) {
  // Try allocating data with a bunch of alignments and sizes
  for (int a = 1; a < 1048576; a *= 2) {
    for (int s = 0; s != -1; s = NextSize(s)) {
      void* ptr = memalign(a, s);
      ASSERT_EQ(Misallignment(ptr, a), 0);
      Fill(ptr, s, 'x');
      CHECK(Valid(ptr, s, 'x'));
      free(ptr);

      if ((a >= sizeof(void*)) && ((a & (a-1)) == 0)) {
        CHECK(posix_memalign(&ptr, a, s) == 0);
        ASSERT_EQ(Misallignment(ptr, a), 0);
        Fill(ptr, s, 'y');
        CHECK(Valid(ptr, s, 'y'));
        free(ptr);
      }
    }
  }

  {
    // Check various corner cases
    void* p1 = memalign(1<<20, 1<<19);
    void* p2 = memalign(1<<19, 1<<19);
    void* p3 = memalign(1<<21, 1<<19);
    ASSERT_EQ(Misallignment(p1, 1<<20), 0);
    ASSERT_EQ(Misallignment(p2, 1<<19), 0);
    ASSERT_EQ(Misallignment(p3, 1<<21), 0);
    Fill(p1, 1<<19, 'a');
    Fill(p2, 1<<19, 'b');
    Fill(p3, 1<<19, 'c');
    CHECK(Valid(p1, 1<<19, 'a'));
    CHECK(Valid(p2, 1<<19, 'b'));
    CHECK(Valid(p3, 1<<19, 'c'));
    free(p1);
    free(p2);
    free(p3);
  }

  {
    // posix_memalign
    void* ptr;
    CHECK(posix_memalign(&ptr, 0, 1) == EINVAL);
    CHECK(posix_memalign(&ptr, sizeof(void*)/2, 1) == EINVAL);
    CHECK(posix_memalign(&ptr, sizeof(void*)+1, 1) == EINVAL);
    CHECK(posix_memalign(&ptr, 4097, 1) == EINVAL);

    // Grab some memory so that the big allocation below will definitely fail.
    void* p_small = noopt(malloc)(4*1048576);
    CHECK_NE(p_small, nullptr);

    // Make sure overflow is returned as ENOMEM
    const size_t zero = 0;
    constexpr size_t kMinusNTimes = 10;
    for ( size_t i = 1; i < kMinusNTimes; ++i ) {
      int r = posix_memalign(&ptr, 1024, zero - i);
      CHECK(r == ENOMEM);
    }

    free(p_small);
  }

  const int pagesize = getpagesize();
  {
    // valloc
    for (int s = 0; s != -1; s = NextSize(s)) {
      void* p = valloc(s);
      ASSERT_EQ(Misallignment(p, pagesize), 0);
      Fill(p, s, 'v');
      CHECK(Valid(p, s, 'v'));
      free(p);
    }
  }

  {
    // pvalloc
    for (int s = 0; s != -1; s = NextSize(s)) {
      void* p = pvalloc(s);
      ASSERT_EQ(Misallignment(p, pagesize), 0);
      int alloc_needed = ((s + pagesize - 1) / pagesize) * pagesize;
      Fill(p, alloc_needed, 'x');
      CHECK(Valid(p, alloc_needed, 'x'));
      free(p);
    }
  }
}